

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.hpp
# Opt level: O3

double cross_entropy<unsigned_long,unsigned_int>
                 (vector<unsigned_long,_std::allocator<unsigned_long>_> *P,
                 vector<unsigned_int,_std::allocator<unsigned_int>_> *Q)

{
  uint uVar1;
  pointer puVar2;
  pointer puVar3;
  bool bVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  ulong uVar7;
  undefined8 uVar8;
  byte bVar9;
  byte bVar10;
  pointer puVar11;
  pointer puVar12;
  ulong uVar13;
  ushort uVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 extraout_var [56];
  undefined1 auVar23 [64];
  undefined1 in_XMM7 [16];
  double local_38;
  double local_28;
  
  puVar11 = (P->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            super__Vector_impl_data._M_start;
  puVar12 = (P->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  local_38 = 0.0;
  local_28 = 0.0;
  if (puVar11 != puVar12) {
    auVar18 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    uVar13 = 0;
    auVar19 = vpbroadcastq_avx512f();
    auVar20 = vpsrlq_avx512f(auVar19,3);
    auVar19 = ZEXT1664((undefined1  [16])0x0);
    do {
      auVar21 = auVar19;
      auVar19 = vpbroadcastq_avx512f();
      auVar19 = vporq_avx512f(auVar19,auVar18);
      uVar7 = vpcmpuq_avx512f(auVar19,auVar20,2);
      auVar19 = vmovdqu64_avx512f(*(undefined1 (*) [64])(puVar11 + uVar13));
      auVar23._8_8_ = (ulong)((byte)(uVar7 >> 1) & 1) * auVar19._8_8_;
      auVar23._0_8_ = (ulong)((byte)uVar7 & 1) * auVar19._0_8_;
      auVar23._16_8_ = (ulong)((byte)(uVar7 >> 2) & 1) * auVar19._16_8_;
      auVar23._24_8_ = (ulong)((byte)(uVar7 >> 3) & 1) * auVar19._24_8_;
      auVar23._32_8_ = (ulong)((byte)(uVar7 >> 4) & 1) * auVar19._32_8_;
      auVar23._40_8_ = (ulong)((byte)(uVar7 >> 5) & 1) * auVar19._40_8_;
      auVar23._48_8_ = (ulong)((byte)(uVar7 >> 6) & 1) * auVar19._48_8_;
      auVar23._56_8_ = (uVar7 >> 7) * auVar19._56_8_;
      uVar13 = uVar13 + 8;
      auVar16 = vpmovqd_avx512f(auVar23);
      auVar16 = vpaddd_avx2(auVar21._0_32_,auVar16);
      auVar19 = ZEXT3264(auVar16);
    } while ((((ulong)((long)puVar12 + (-8 - (long)puVar11)) >> 3) + 8 & 0xfffffffffffffff8) !=
             uVar13);
    auVar16 = vmovdqa32_avx512vl(auVar16);
    bVar4 = (bool)((byte)uVar7 & 1);
    auVar15._0_4_ = (uint)bVar4 * auVar16._0_4_ | (uint)!bVar4 * auVar21._0_4_;
    bVar4 = (bool)((byte)(uVar7 >> 1) & 1);
    auVar15._4_4_ = (uint)bVar4 * auVar16._4_4_ | (uint)!bVar4 * auVar21._4_4_;
    bVar4 = (bool)((byte)(uVar7 >> 2) & 1);
    auVar15._8_4_ = (uint)bVar4 * auVar16._8_4_ | (uint)!bVar4 * auVar21._8_4_;
    bVar4 = (bool)((byte)(uVar7 >> 3) & 1);
    auVar15._12_4_ = (uint)bVar4 * auVar16._12_4_ | (uint)!bVar4 * auVar21._12_4_;
    bVar4 = (bool)((byte)(uVar7 >> 4) & 1);
    auVar17._16_4_ = (uint)bVar4 * auVar16._16_4_ | (uint)!bVar4 * auVar21._16_4_;
    auVar17._0_16_ = auVar15;
    bVar4 = (bool)((byte)(uVar7 >> 5) & 1);
    auVar17._20_4_ = (uint)bVar4 * auVar16._20_4_ | (uint)!bVar4 * auVar21._20_4_;
    bVar4 = (bool)((byte)(uVar7 >> 6) & 1);
    auVar17._24_4_ = (uint)bVar4 * auVar16._24_4_ | (uint)!bVar4 * auVar21._24_4_;
    bVar4 = SUB81(uVar7 >> 7,0);
    auVar17._28_4_ = (uint)bVar4 * auVar16._28_4_ | (uint)!bVar4 * auVar21._28_4_;
    auVar15 = vphaddd_avx(auVar17._16_16_,auVar15);
    auVar15 = vphaddd_avx(auVar15,auVar15);
    auVar15 = vphaddd_avx(auVar15,auVar15);
    auVar15 = vcvtdq2pd_avx(auVar15);
    local_28 = auVar15._0_8_;
  }
  puVar2 = (Q->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar3 = (Q->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (puVar2 != puVar3) {
    auVar19 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar18 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    auVar23 = ZEXT1664((undefined1  [16])0x0);
    uVar13 = 0;
    auVar20 = vpbroadcastq_avx512f();
    auVar20 = vpsrlq_avx512f(auVar20,2);
    do {
      auVar21 = vpbroadcastq_avx512f();
      auVar22 = vmovdqa64_avx512f(auVar23);
      auVar23 = vporq_avx512f(auVar21,auVar19);
      auVar21 = vporq_avx512f(auVar21,auVar18);
      uVar8 = vpcmpuq_avx512f(auVar21,auVar20,2);
      bVar9 = (byte)uVar8;
      uVar8 = vpcmpuq_avx512f(auVar23,auVar20,2);
      bVar10 = (byte)uVar8;
      uVar14 = CONCAT11(bVar10,bVar9);
      auVar23 = vmovdqu32_avx512f(*(undefined1 (*) [64])(puVar2 + uVar13));
      auVar21._4_4_ = (uint)((byte)(uVar14 >> 1) & 1) * auVar23._4_4_;
      auVar21._0_4_ = (uint)(bVar9 & 1) * auVar23._0_4_;
      auVar21._8_4_ = (uint)((byte)(uVar14 >> 2) & 1) * auVar23._8_4_;
      auVar21._12_4_ = (uint)((byte)(uVar14 >> 3) & 1) * auVar23._12_4_;
      auVar21._16_4_ = (uint)((byte)(uVar14 >> 4) & 1) * auVar23._16_4_;
      auVar21._20_4_ = (uint)((byte)(uVar14 >> 5) & 1) * auVar23._20_4_;
      auVar21._24_4_ = (uint)((byte)(uVar14 >> 6) & 1) * auVar23._24_4_;
      auVar21._28_4_ = (uint)((byte)(uVar14 >> 7) & 1) * auVar23._28_4_;
      auVar21._32_4_ = (uint)(bVar10 & 1) * auVar23._32_4_;
      auVar21._36_4_ = (uint)(bVar10 >> 1 & 1) * auVar23._36_4_;
      auVar21._40_4_ = (uint)(bVar10 >> 2 & 1) * auVar23._40_4_;
      auVar21._44_4_ = (uint)(bVar10 >> 3 & 1) * auVar23._44_4_;
      auVar21._48_4_ = (uint)(bVar10 >> 4 & 1) * auVar23._48_4_;
      auVar21._52_4_ = (uint)(bVar10 >> 5 & 1) * auVar23._52_4_;
      auVar21._56_4_ = (uint)(bVar10 >> 6 & 1) * auVar23._56_4_;
      auVar21._60_4_ = (uint)(bVar10 >> 7) * auVar23._60_4_;
      uVar13 = uVar13 + 0x10;
      auVar23 = vpaddd_avx512f(auVar21,auVar22);
    } while ((((ulong)((long)puVar3 + (-4 - (long)puVar2)) >> 2) + 0x10 & 0xfffffffffffffff0) !=
             uVar13);
    auVar19 = vmovdqa32_avx512f(auVar23);
    auVar18._0_4_ = (uint)(bVar9 & 1) * auVar19._0_4_ | (uint)!(bool)(bVar9 & 1) * auVar22._0_4_;
    bVar4 = (bool)((byte)(uVar14 >> 1) & 1);
    auVar18._4_4_ = (uint)bVar4 * auVar19._4_4_ | (uint)!bVar4 * auVar22._4_4_;
    bVar4 = (bool)((byte)(uVar14 >> 2) & 1);
    auVar18._8_4_ = (uint)bVar4 * auVar19._8_4_ | (uint)!bVar4 * auVar22._8_4_;
    bVar4 = (bool)((byte)(uVar14 >> 3) & 1);
    auVar18._12_4_ = (uint)bVar4 * auVar19._12_4_ | (uint)!bVar4 * auVar22._12_4_;
    bVar4 = (bool)((byte)(uVar14 >> 4) & 1);
    auVar18._16_4_ = (uint)bVar4 * auVar19._16_4_ | (uint)!bVar4 * auVar22._16_4_;
    bVar4 = (bool)((byte)(uVar14 >> 5) & 1);
    auVar18._20_4_ = (uint)bVar4 * auVar19._20_4_ | (uint)!bVar4 * auVar22._20_4_;
    bVar4 = (bool)((byte)(uVar14 >> 6) & 1);
    auVar18._24_4_ = (uint)bVar4 * auVar19._24_4_ | (uint)!bVar4 * auVar22._24_4_;
    bVar4 = (bool)((byte)(uVar14 >> 7) & 1);
    auVar18._28_4_ = (uint)bVar4 * auVar19._28_4_ | (uint)!bVar4 * auVar22._28_4_;
    auVar18._32_4_ =
         (uint)(bVar10 & 1) * auVar19._32_4_ | (uint)!(bool)(bVar10 & 1) * auVar22._32_4_;
    bVar4 = (bool)(bVar10 >> 1 & 1);
    auVar18._36_4_ = (uint)bVar4 * auVar19._36_4_ | (uint)!bVar4 * auVar22._36_4_;
    bVar4 = (bool)(bVar10 >> 2 & 1);
    auVar18._40_4_ = (uint)bVar4 * auVar19._40_4_ | (uint)!bVar4 * auVar22._40_4_;
    bVar4 = (bool)(bVar10 >> 3 & 1);
    auVar18._44_4_ = (uint)bVar4 * auVar19._44_4_ | (uint)!bVar4 * auVar22._44_4_;
    bVar4 = (bool)(bVar10 >> 4 & 1);
    auVar18._48_4_ = (uint)bVar4 * auVar19._48_4_ | (uint)!bVar4 * auVar22._48_4_;
    bVar4 = (bool)(bVar10 >> 5 & 1);
    auVar18._52_4_ = (uint)bVar4 * auVar19._52_4_ | (uint)!bVar4 * auVar22._52_4_;
    bVar4 = (bool)(bVar10 >> 6 & 1);
    auVar18._56_4_ = (uint)bVar4 * auVar19._56_4_ | (uint)!bVar4 * auVar22._56_4_;
    auVar18._60_4_ =
         (uint)(bVar10 >> 7) * auVar19._60_4_ | (uint)!(bool)(bVar10 >> 7) * auVar22._60_4_;
    auVar16 = vextracti64x4_avx512f(auVar18,1);
    auVar19 = vpaddd_avx512f(auVar18,ZEXT3264(auVar16));
    auVar15 = vpaddd_avx(auVar19._0_16_,auVar19._16_16_);
    auVar5 = vpshufd_avx(auVar15,0xee);
    auVar15 = vpaddd_avx(auVar15,auVar5);
    auVar5 = vpshufd_avx(auVar15,0x55);
    auVar15 = vpaddd_avx(auVar15,auVar5);
    auVar15 = vcvtdq2pd_avx(auVar15);
    local_38 = auVar15._0_8_;
  }
  auVar15 = ZEXT816(0);
  auVar19 = ZEXT1664(auVar15);
  if (puVar11 != puVar12) {
    uVar13 = 0;
    do {
      if ((puVar11[uVar13] != 0) &&
         (uVar1 = (Q->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                  super__Vector_impl_data._M_start[uVar13], uVar1 != 0)) {
        auVar6 = vcvtusi2sd_avx512f(in_XMM7,puVar11[uVar13]);
        auVar15 = vcvtusi2sd_avx512f(in_XMM7,uVar1);
        auVar20._0_8_ = log2(auVar15._0_8_ / local_38);
        auVar20._8_56_ = extraout_var;
        puVar11 = (P->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        puVar12 = (P->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                  super__Vector_impl_data._M_finish;
        auVar5._8_8_ = 0;
        auVar5._0_8_ = auVar6._0_8_ / local_28;
        auVar15 = vfmadd231sd_fma(auVar19._0_16_,auVar20._0_16_,auVar5);
        auVar19 = ZEXT1664(auVar15);
      }
      auVar15 = auVar19._0_16_;
      uVar13 = uVar13 + 1;
    } while (uVar13 < (ulong)((long)puVar12 - (long)puVar11 >> 3));
  }
  auVar6._8_8_ = 0x8000000000000000;
  auVar6._0_8_ = 0x8000000000000000;
  auVar15 = vxorpd_avx512vl(auVar15,auVar6);
  return auVar15._0_8_;
}

Assistant:

double cross_entropy(const std::vector<X>& P, const std::vector<Y>& Q)
{
    double H0 = 0.0;
    double n = std::accumulate(std::begin(P), std::end(P), 0);
    double m = std::accumulate(std::begin(Q), std::end(Q), 0);
    for (size_t i = 0; i < P.size(); i++) {
        if (P[i] != 0 && Q[i] != 0) {
            double p = double(P[i]) / n;
            double q = double(Q[i]) / m;
            H0 += (p * log2(q));
        }
    }
    return -H0;
}